

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ArgBuilder __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::operator[](CommandLine<Catch::ConfigData> *this)

{
  ArgBuilder AVar1;
  logic_error *this_00;
  
  if ((this->m_floatingArg)._M_t.
      super___uniq_ptr_impl<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
      .super__Head_base<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_false>.
      _M_head_impl == (Arg *)0x0) {
    AVar1.m_arg = (Arg *)operator_new(0xa8);
    ((AVar1.m_arg)->super_CommonArgProperties<Catch::ConfigData>).boundField.functionObj =
         (IArgFunction<Catch::ConfigData> *)0x0;
    ((AVar1.m_arg)->super_CommonArgProperties<Catch::ConfigData>).description._M_dataplus._M_p =
         (pointer)&((AVar1.m_arg)->super_CommonArgProperties<Catch::ConfigData>).description.field_2
    ;
    ((AVar1.m_arg)->super_CommonArgProperties<Catch::ConfigData>).description._M_string_length = 0;
    ((AVar1.m_arg)->super_CommonArgProperties<Catch::ConfigData>).description.field_2._M_local_buf
    [0] = '\0';
    ((AVar1.m_arg)->super_CommonArgProperties<Catch::ConfigData>).detail._M_dataplus._M_p =
         (pointer)&((AVar1.m_arg)->super_CommonArgProperties<Catch::ConfigData>).detail.field_2;
    ((AVar1.m_arg)->super_CommonArgProperties<Catch::ConfigData>).detail._M_string_length = 0;
    ((AVar1.m_arg)->super_CommonArgProperties<Catch::ConfigData>).detail.field_2._M_local_buf[0] =
         '\0';
    ((AVar1.m_arg)->super_CommonArgProperties<Catch::ConfigData>).placeholder._M_dataplus._M_p =
         (pointer)&((AVar1.m_arg)->super_CommonArgProperties<Catch::ConfigData>).placeholder.field_2
    ;
    ((AVar1.m_arg)->super_CommonArgProperties<Catch::ConfigData>).placeholder._M_string_length = 0;
    ((AVar1.m_arg)->super_CommonArgProperties<Catch::ConfigData>).placeholder.field_2._M_local_buf
    [0] = '\0';
    ((AVar1.m_arg)->super_OptionArgProperties).shortNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)&((AVar1.m_arg)->super_OptionArgProperties).shortNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&((AVar1.m_arg)->super_OptionArgProperties).shortNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl + 0x10) = (pointer)0x0;
    ((AVar1.m_arg)->super_OptionArgProperties).longName._M_dataplus._M_p =
         (pointer)&((AVar1.m_arg)->super_OptionArgProperties).longName.field_2;
    ((AVar1.m_arg)->super_OptionArgProperties).longName._M_string_length = 0;
    ((AVar1.m_arg)->super_OptionArgProperties).longName.field_2._M_local_buf[0] = '\0';
    ((AVar1.m_arg)->super_PositionalArgProperties).position = -1;
    (this->m_floatingArg)._M_t.
    super___uniq_ptr_impl<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
    ._M_t.
    super__Tuple_impl<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
    .super__Head_base<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_false>._M_head_impl
         = AVar1.m_arg;
    return (ArgBuilder)AVar1.m_arg;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Only one unpositional argument can be added");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

ArgBuilder operator[]( UnpositionalTag ) {
            if( m_floatingArg.get() )
                throw std::logic_error( "Only one unpositional argument can be added" );
            m_floatingArg = ArgAutoPtr( new Arg() );
            ArgBuilder builder( m_floatingArg.get() );
            return builder;
        }